

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void increment(char *s)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(s);
  uVar2 = sVar1 & 0xffffffff;
  while( true ) {
    if ((int)uVar2 < 1) {
      return;
    }
    if (s[uVar2 - 1] != '9') break;
    s[uVar2 - 1] = '0';
    uVar2 = uVar2 - 1;
  }
  s[uVar2 - 1] = s[uVar2 - 1] + '\x01';
  return;
}

Assistant:

void increment(char *s) {
  for (int i = static_cast<int>(std::strlen(s)) - 1; i >= 0; --i) {
    if (s[i] != '9') {
      ++s[i];
      break;
    }
    s[i] = '0';
  }
}